

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.hpp
# Opt level: O2

void __thiscall
deqp::gls::fboc::details::ParamTest<deqp::gles3::Functional::NumLayersParams>::ParamTest
          (ParamTest<deqp::gles3::Functional::NumLayersParams> *this,Context *ctx,Params *params)

{
  GLsizei GVar1;
  NumLayersParams *params_00;
  string sStack_58;
  string local_38;
  
  deqp::gles3::Functional::NumLayersParams::getName_abi_cxx11_(&local_38,params,params);
  deqp::gles3::Functional::NumLayersParams::getDescription_abi_cxx11_(&sStack_58,params,params_00);
  TestBase::TestBase(&this->super_TestBase,ctx,&local_38,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e3c130;
  GVar1 = params->numLayers;
  (this->m_params).textureKind = params->textureKind;
  (this->m_params).numLayers = GVar1;
  (this->m_params).attachmentLayer = params->attachmentLayer;
  return;
}

Assistant:

ParamTest		(Context& ctx, const Params& params)
					: TestBase	(ctx, Params::getName(params), Params::getDescription(params))
					, m_params	(params) {}